

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void parse_assignment(LexState *ls,LHSVarList *lh,BCReg nvars)

{
  bool bVar1;
  BCReg BVar2;
  undefined4 uVar3;
  LHSVarList *pLVar4;
  FuncState *pFVar5;
  FuncState *fs;
  LHSVarList vl;
  anon_union_8_3_2ce71dea_for_u local_40;
  undefined8 local_38;
  undefined4 local_30;
  LHSVarList *local_28;
  
  if (3 < (lh->v).k - VLOCAL) {
    err_syntax(ls,LJ_ERR_XSYNTAX);
  }
  if (ls->tok == 0x2c) {
    lj_lex_next(ls);
    local_28 = lh;
    expr_primary(ls,(ExpDesc *)&local_40.s);
    if ((int)local_38 == 6) {
      pFVar5 = ls->fs;
      BVar2 = pFVar5->freereg;
      bVar1 = false;
      pLVar4 = lh;
      do {
        while ((pLVar4->v).k != VINDEXED) {
LAB_00119b23:
          pLVar4 = pLVar4->prev;
          if (pLVar4 == (LHSVarList *)0x0) {
            if (!bVar1) goto LAB_00119b50;
            goto LAB_00119b30;
          }
        }
        if ((pLVar4->v).u.s.info == local_40.s.info) {
          (pLVar4->v).u.s.info = BVar2;
          bVar1 = true;
        }
        if ((pLVar4->v).u.s.aux != local_40.s.info) goto LAB_00119b23;
        (pLVar4->v).u.s.aux = BVar2;
        pLVar4 = pLVar4->prev;
        bVar1 = true;
      } while (pLVar4 != (LHSVarList *)0x0);
LAB_00119b30:
      bcemit_INS(pFVar5,local_40.s.info << 0x10 | BVar2 << 8 | 0x12);
      bcreg_reserve(pFVar5,1);
    }
LAB_00119b50:
    if (199 < ls->level + nvars) {
      err_limit(ls->fs,200,"variable names");
    }
    parse_assignment(ls,(LHSVarList *)&local_40.s,nvars + 1);
  }
  else {
    lex_check(ls,0x3d);
    BVar2 = expr_list(ls,(ExpDesc *)&local_40.s);
    if (BVar2 == nvars) {
      pFVar5 = ls->fs;
      if ((int)local_38 == 0xd) {
        if ((char)pFVar5->bcbase[local_40.s.info].ins == 'G') {
          pFVar5->freereg = pFVar5->freereg - 1;
          uVar3 = 0xb;
        }
        else {
          local_40.s.info = local_40.s.aux;
          uVar3 = 0xc;
        }
        local_38 = CONCAT44(local_38._4_4_,uVar3);
      }
      goto LAB_00119c04;
    }
    assign_adjust(ls,nvars,BVar2,(ExpDesc *)&local_40.s);
  }
  pFVar5 = ls->fs;
  local_40.s.info = pFVar5->freereg - 1;
  local_38 = 0xffffffff0000000c;
  local_30 = 0xffffffff;
LAB_00119c04:
  bcemit_store(pFVar5,&lh->v,(ExpDesc *)&local_40.s);
  return;
}

Assistant:

static void parse_assignment(LexState *ls, LHSVarList *lh, BCReg nvars)
{
  ExpDesc e;
  checkcond(ls, VLOCAL <= lh->v.k && lh->v.k <= VINDEXED, LJ_ERR_XSYNTAX);
  if (lex_opt(ls, ',')) {  /* Collect LHS list and recurse upwards. */
    LHSVarList vl;
    vl.prev = lh;
    expr_primary(ls, &vl.v);
    if (vl.v.k == VLOCAL)
      assign_hazard(ls, lh, &vl.v);
    checklimit(ls->fs, ls->level + nvars, LJ_MAX_XLEVEL, "variable names");
    parse_assignment(ls, &vl, nvars+1);
  } else {  /* Parse RHS. */
    BCReg nexps;
    lex_check(ls, '=');
    nexps = expr_list(ls, &e);
    if (nexps == nvars) {
      if (e.k == VCALL) {
	if (bc_op(*bcptr(ls->fs, &e)) == BC_VARG) {  /* Vararg assignment. */
	  ls->fs->freereg--;
	  e.k = VRELOCABLE;
	} else {  /* Multiple call results. */
	  e.u.s.info = e.u.s.aux;  /* Base of call is not relocatable. */
	  e.k = VNONRELOC;
	}
      }
      bcemit_store(ls->fs, &lh->v, &e);
      return;
    }
    assign_adjust(ls, nvars, nexps, &e);
  }
  /* Assign RHS to LHS and recurse downwards. */
  expr_init(&e, VNONRELOC, ls->fs->freereg-1);
  bcemit_store(ls->fs, &lh->v, &e);
}